

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::IReporter> * __thiscall
Catch::Ptr<Catch::IReporter>::operator=(Ptr<Catch::IReporter> *this,IReporter *p)

{
  Ptr<Catch::IReporter> local_18;
  
  if (p != (IReporter *)0x0) {
    (*(p->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(p);
  }
  local_18 = (Ptr<Catch::IReporter>)this->m_p;
  this->m_p = p;
  ~Ptr(&local_18);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }